

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O1

void __thiscall
cfd::core::CfdException::CfdException(CfdException *this,CfdError error_code,string *message)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__CfdException_00694dd8;
  this->error_code_ = error_code;
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

CfdException(CfdError error_code, const std::string& message)
      : error_code_(error_code), message_(message) {}